

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O3

int Rpo_CheckORGroup(Literal_t *lit1,Literal_t *lit2,int nVars)

{
  long lVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  void *__ptr;
  void *__ptr_00;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  uVar8 = (ulong)uVar4;
  __ptr = malloc((long)(int)uVar4 * 4);
  __ptr_00 = malloc((long)(int)uVar4 * 4);
  uVar6 = uVar8;
  if (0 < (int)uVar4) {
    puVar2 = lit1->transition;
    puVar3 = lit2->function;
    uVar5 = uVar8 + 1;
    do {
      *(uint *)((long)__ptr + uVar5 * 4 + -8) = puVar3[uVar5 - 2] & puVar2[uVar5 - 2];
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  do {
    if ((int)uVar6 < 1) {
      if (0 < (int)uVar4) {
        puVar2 = lit2->transition;
        puVar3 = lit1->function;
        uVar6 = uVar8 + 1;
        do {
          *(uint *)((long)__ptr_00 + uVar6 * 4 + -8) = puVar3[uVar6 - 2] & puVar2[uVar6 - 2];
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
      }
      goto LAB_005eaafd;
    }
    lVar1 = uVar6 * 4;
    uVar6 = uVar6 - 1;
  } while (*(int *)((long)__ptr + lVar1 + -4) == 0);
  iVar7 = 0;
  goto LAB_005eab10;
  while (lVar1 = uVar8 * 4, uVar8 = uVar8 - 1, *(int *)((long)__ptr_00 + lVar1 + -4) == 0) {
LAB_005eaafd:
    if ((int)uVar8 < 1) {
      iVar7 = 1;
      goto LAB_005eab0b;
    }
  }
  iVar7 = 0;
LAB_005eab0b:
  if (__ptr == (void *)0x0) goto LAB_005eab18;
LAB_005eab10:
  free(__ptr);
LAB_005eab18:
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return iVar7;
}

Assistant:

int Rpo_CheckORGroup(Literal_t* lit1, Literal_t* lit2, int nVars) {
    unsigned* and1 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    unsigned* and2 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    int isZero;
    Kit_TruthAnd(and1, lit1->transition, lit2->function, nVars);
    isZero = Kit_TruthIsConst0(and1, nVars);
    if (isZero) {
        Kit_TruthAnd(and2, lit2->transition, lit1->function, nVars);
        isZero = Kit_TruthIsConst0(and2, nVars);
    }
    ABC_FREE(and1);
    ABC_FREE(and2);
    return isZero;
}